

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCheckingVisitor.cpp
# Opt level: O2

void __thiscall TypeCheckingVisitor::Visit(TypeCheckingVisitor *this,IfStatement *statement)

{
  int iVar1;
  int iVar2;
  mapped_type *pmVar3;
  runtime_error *this_00;
  allocator<char> local_41;
  key_type local_40;
  
  iVar2 = TemplateVisitor<int>::Accept
                    ((TemplateVisitor<int> *)this,&statement->expression_->super_Node);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"boolean",&local_41);
  pmVar3 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->type_system_,&local_40);
  iVar1 = *pmVar3;
  std::__cxx11::string::~string((string *)&local_40);
  if (iVar2 == iVar1) {
    TemplateVisitor<int>::Accept((TemplateVisitor<int> *)this,&statement->if_statement_->super_Node)
    ;
    if (&statement->else_statement_->super_Node != (Node *)0x0) {
      TemplateVisitor<int>::Accept
                ((TemplateVisitor<int> *)this,&statement->else_statement_->super_Node);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Non-boolean expr in if condition");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void TypeCheckingVisitor::Visit(IfStatement* statement) {
  if (Accept(statement->expression_) != type_system_["boolean"]) {
    throw std::runtime_error("Non-boolean expr in if condition");
  }

  Accept(statement->if_statement_);

  if (statement->else_statement_) {
    Accept(statement->else_statement_);
  }
}